

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5OpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  sqlite3_module *psVar1;
  _func_int_sqlite3_vtab_ptr *p_Var2;
  sqlite3_uint64 n;
  Fts5Global *pGlobal;
  int rc;
  sqlite3_int64 nByte;
  Fts5Cursor *pCsr;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  sqlite3_vtab_cursor **ppCsr_local;
  sqlite3_vtab *pVTab_local;
  
  psVar1 = pVTab[1].pModule;
  nByte = 0;
  pGlobal._4_4_ = fts5NewTransaction((Fts5FullTable *)pVTab);
  if (pGlobal._4_4_ == 0) {
    n = (long)*(int *)&psVar1->xBestIndex * 4 + 0xb8;
    nByte = (sqlite3_int64)sqlite3_malloc64(n);
    if ((_func_int_sqlite3_vtab_cursor_ptr *)nByte == (_func_int_sqlite3_vtab_cursor_ptr *)0x0) {
      pGlobal._4_4_ = 7;
    }
    else {
      psVar1 = pVTab[2].pModule;
      memset((void *)nByte,0,n);
      *(code **)(nByte + 0x10) = (code *)(nByte + 0xb8);
      *(_func_int_sqlite3_vtab_cursor_ptr **)(nByte + 8) = psVar1->xNext;
      psVar1->xNext = (_func_int_sqlite3_vtab_cursor_ptr *)nByte;
      p_Var2 = psVar1->xDestroy;
      psVar1->xDestroy = p_Var2 + 1;
      *(_func_int_sqlite3_vtab_ptr **)(nByte + 0x18) = p_Var2 + 1;
    }
  }
  *ppCsr = (sqlite3_vtab_cursor *)nByte;
  return pGlobal._4_4_;
}

Assistant:

static int fts5OpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  Fts5FullTable *pTab = (Fts5FullTable*)pVTab;
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = 0;           /* New cursor object */
  sqlite3_int64 nByte;            /* Bytes of space to allocate */
  int rc;                         /* Return code */

  rc = fts5NewTransaction(pTab);
  if( rc==SQLITE_OK ){
    nByte = sizeof(Fts5Cursor) + pConfig->nCol * sizeof(int);
    pCsr = (Fts5Cursor*)sqlite3_malloc64(nByte);
    if( pCsr ){
      Fts5Global *pGlobal = pTab->pGlobal;
      memset(pCsr, 0, (size_t)nByte);
      pCsr->aColumnSize = (int*)&pCsr[1];
      pCsr->pNext = pGlobal->pCsr;
      pGlobal->pCsr = pCsr;
      pCsr->iCsrId = ++pGlobal->iNextId;
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}